

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestCompressionF<Counter<unsigned_long,64u>,Counter<unsigned_char,4u>>(int bias)

{
  Counter<unsigned_char,_4U> local_181;
  Counter<unsigned_long,_64U> local_180;
  Counter<unsigned_long,_64U> local_178;
  Counter<unsigned_char,_4U> local_169;
  Counter<unsigned_long,_64U> local_168;
  Counter<unsigned_long,_64U> local_160;
  Counter<unsigned_long,_64U> expanded;
  int delta_1;
  int delta;
  Counter<unsigned_char,_4U> truncatedRecent;
  Counter<unsigned_long,_64U> fullRecent;
  uint recent;
  Counter<unsigned_char,_4U> truncatedOriginal;
  Counter<unsigned_long,_64U> fullOriginal;
  uint original;
  uint range;
  int bias_local;
  Counter<unsigned_long,_64U> local_e0;
  ulong local_d8;
  unsigned_long absDiff_1;
  ulong local_c8;
  unsigned_long absDiff;
  unsigned_long recentLow;
  Counter<unsigned_char,_4U> *local_b0;
  Counter<unsigned_long,_64U> *local_a8;
  Counter<unsigned_long,_64U> *local_a0;
  ThisType *result;
  Counter<unsigned_long,_64U> *local_90;
  Counter<unsigned_char,_4U> *local_88;
  Counter<unsigned_char,_4U> *local_80;
  Counter<unsigned_char,_4U> *local_78;
  Counter<unsigned_char,_4U> *local_70;
  long local_68;
  SignedType gapSigned;
  ValueType gapMSB;
  ValueType_conflict2 gap;
  long lStack_50;
  ValueType_conflict2 smallRecent;
  SignedType smallerSigned;
  ValueType smallerMSB;
  Counter<unsigned_long,_64U> *local_38;
  Counter<unsigned_long,_64U> *local_30;
  unsigned_long *local_28;
  Counter<unsigned_long,_64U> *local_20;
  Counter<unsigned_long,_64U> *local_18;
  Counter<unsigned_long,_64U> *local_10;
  
  fullOriginal.Value._0_4_ = 0;
  do {
    if (0x1f < (uint)fullOriginal.Value) {
      return true;
    }
    Counter<unsigned_long,_64U>::Counter
              ((Counter<unsigned_long,_64U> *)&recent,(ulong)(uint)fullOriginal.Value);
    Counter<unsigned_char,_4U>::Counter
              ((Counter<unsigned_char,_4U> *)((long)&fullRecent.Value + 7),'\0');
    Counter<unsigned_char,_4U>::operator=
              ((Counter<unsigned_char,_4U> *)((long)&fullRecent.Value + 7),(uchar)_recent);
    for (fullRecent.Value._0_4_ = 0; (uint)fullRecent.Value < 0x20;
        fullRecent.Value._0_4_ = (uint)fullRecent.Value + 1) {
      Counter<unsigned_long,_64U>::Counter
                ((Counter<unsigned_long,_64U> *)&delta,(ulong)(uint)fullRecent.Value);
      Counter<unsigned_char,_4U>::Counter((Counter<unsigned_char,_4U> *)((long)&delta_1 + 3),'\0');
      Counter<unsigned_char,_4U>::operator=
                ((Counter<unsigned_char,_4U> *)((long)&delta_1 + 3),(uchar)_delta);
      if ((uint)fullRecent.Value < (uint)fullOriginal.Value) {
        if ((int)((uint)fullOriginal.Value - (uint)fullRecent.Value) < 8 - bias) {
LAB_00113aaf:
          Counter<unsigned_long,_64U>::Counter(&local_168,(ThisType *)&delta);
          Counter<unsigned_char,_4U>::Counter(&local_169,(ThisType *)((long)&fullRecent.Value + 7));
          recentLow = (unsigned_long)bias;
          local_a0 = &local_160;
          local_a8 = &local_168;
          local_b0 = &local_169;
          local_70 = &local_169;
          local_90 = &local_168;
          Counter<unsigned_long,_64U>::Counter
                    (&local_160,(ulong)local_169.Value | local_168.Value & 0xfffffffffffffff0);
          result = &local_168;
          absDiff = local_168.Value & 0xf;
          local_78 = &local_169;
          if (absDiff < local_169.Value) {
            local_80 = &local_169;
            local_c8 = local_169.Value - absDiff;
            if (8 - recentLow <= local_c8) {
              Counter<unsigned_long,_64U>::Counter((Counter<unsigned_long,_64U> *)&absDiff_1,0x10);
              local_20 = &local_160;
              local_28 = &absDiff_1;
              local_160.Value = local_160.Value - absDiff_1;
            }
          }
          else {
            local_88 = &local_169;
            local_d8 = absDiff - local_169.Value;
            if (recentLow + 8 < local_d8) {
              Counter<unsigned_long,_64U>::Counter(&local_e0,0x10);
              local_10 = &local_160;
              local_18 = &local_e0;
              local_160.Value = local_160.Value + local_e0.Value;
            }
          }
          if (local_160.Value != _recent) {
            return false;
          }
          if (bias == 0) {
            Counter<unsigned_long,_64U>::Counter(&local_180,(ThisType *)&delta);
            Counter<unsigned_char,_4U>::Counter
                      (&local_181,(ThisType *)((long)&fullRecent.Value + 7));
            local_30 = &local_178;
            local_38 = &local_180;
            smallerMSB = (ValueType)&local_181;
            smallerSigned = (SignedType)(int)(local_181.Value & 8);
            lStack_50 = (ulong)local_181.Value + smallerSigned * -2;
            gapMSB._7_1_ = (byte)local_180.Value & 0xf;
            gapMSB._6_1_ = (char)lStack_50 - gapMSB._7_1_ & 0xf;
            gapSigned = (SignedType)(int)(gapMSB._6_1_ & 8);
            local_68 = (ulong)gapMSB._6_1_ + gapSigned * -2;
            Counter<unsigned_long,_64U>::Counter(&local_178,local_180.Value + local_68);
            Counter<unsigned_long,_64U>::operator=(&local_160,&local_178);
            if (local_160.Value != _recent) {
              return false;
            }
          }
        }
      }
      else {
        expanded.Value._4_4_ = (uint)fullRecent.Value - (uint)fullOriginal.Value;
        if (expanded.Value._4_4_ <= bias + 8) goto LAB_00113aaf;
      }
    }
    fullOriginal.Value._0_4_ = (uint)fullOriginal.Value + 1;
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}